

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase273::run(TestCase273 *this)

{
  TransformPromiseNodeBase *this_00;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_a8;
  Own<kj::_::PromiseNode> local_98;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_78,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:278:23),_kj::_::PropagateException>
             ::anon_class_8_1_70ebebfb_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041aa20;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&promise;
  local_a8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase273::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase273::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_a8.ptr = (PromiseNode *)0x0;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase273::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  local_98.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  Own<kj::_::PromiseNode>::dispose(&local_78);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_98);
  Own<kj::_::PromiseNode>::dispose(&local_98);
  local_68.disposer = promise.super_PromiseBase.node.disposer;
  local_68.ptr = promise.super_PromiseBase.node.ptr;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  makeChain2((anon_unknown_0 *)&local_a8,1000,(Promise<void> *)&local_68);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_a8);
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Promise<void>::wait(&promise,&waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, DeepChain4) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  promise = makeChain2(1000, kj::mv(promise));

  promise.wait(waitScope);
}